

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O0

QVariant * __thiscall
HtmlModelSerialiserPrivate::readHtmlVariant
          (QVariant *__return_storage_ptr__,HtmlModelSerialiserPrivate *this,
          QXmlStreamReader *reader,int valType)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  QString *val;
  QString local_1d8;
  QArrayDataPointer<char16_t> local_1c0;
  QString local_1a8;
  QArrayDataPointer<char16_t> local_190;
  QString local_178;
  QStringView local_160;
  QString local_150;
  undefined4 local_134;
  QArrayDataPointer<char16_t> local_130;
  QString local_118;
  QXmlStreamAttributes local_100 [8];
  QXmlStreamAttributes imgAttributes;
  QArrayDataPointer<char16_t> local_d8;
  QString local_c0;
  QStringView local_a8;
  QStringView local_98;
  int local_84;
  QXmlStreamReader *pQStack_80;
  int valType_local;
  QXmlStreamReader *reader_local;
  HtmlModelSerialiserPrivate *this_local;
  char16_t *local_68;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_10;
  
  local_84 = valType;
  pQStack_80 = reader;
  reader_local = (QXmlStreamReader *)this;
  this_local = (HtmlModelSerialiserPrivate *)__return_storage_ptr__;
  bVar2 = isImageType(valType);
  iVar1 = local_84;
  if (bVar2) {
    uVar3 = QXmlStreamReader::readNextStartElement();
    if ((uVar3 & 1) == 0) {
      ::QVariant::QVariant(__return_storage_ptr__);
    }
    else {
      local_98 = (QStringView)QXmlStreamReader::name();
      str = L"img";
      local_38 = L"img";
      local_28 = &local_d8;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_d8,(Data *)0x0,L"img",3);
      QString::QString(&local_c0,&local_d8);
      QStringView::QStringView<QString,_true>(&local_a8,&local_c0);
      bVar2 = ::operator!=(local_98,local_a8);
      QString::~QString(&local_c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      if (bVar2) {
        ::QVariant::QVariant(__return_storage_ptr__);
      }
      else {
        QXmlStreamReader::attributes();
        local_40 = &local_130;
        str_1 = L"src";
        local_50 = L"src";
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_130,(Data *)0x0,L"src",3);
        QString::QString(&local_118,&local_130);
        bVar2 = QXmlStreamAttributes::hasAttribute(local_100,&local_118);
        QString::~QString(&local_118);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
        iVar1 = local_84;
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          local_58 = &local_190;
          str_2 = L"src";
          local_68 = L"src";
          QArrayDataPointer<char16_t>::QArrayDataPointer(&local_190,(Data *)0x0,L"src",3);
          QString::QString(&local_178,&local_190);
          local_160 = (QStringView)QXmlStreamAttributes::value((QString *)local_100);
          QStringView::toString(&local_150,&local_160);
          local_10 = &local_1c0;
          str_3 = L"data:image/png;base64,";
          local_20 = L"data:image/png;base64,";
          QArrayDataPointer<char16_t>::QArrayDataPointer
                    (&local_1c0,(Data *)0x0,L"data:image/png;base64,",0x16);
          QString::QString(&local_1a8,&local_1c0);
          QString::size(&local_1a8);
          val = (QString *)QString::remove((longlong)&local_150,0);
          AbstractStringSerialiserPrivate::loadVariant
                    (__return_storage_ptr__,&this->super_AbstractStringSerialiserPrivate,iVar1,val);
          QString::~QString(&local_1a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c0);
          QString::~QString(&local_150);
          QString::~QString(&local_178);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
        }
        else {
          ::QVariant::QVariant(__return_storage_ptr__);
        }
        local_134 = 1;
        QXmlStreamAttributes::~QXmlStreamAttributes(local_100);
      }
    }
  }
  else {
    QXmlStreamReader::readElementText(&local_1d8,pQStack_80,0);
    AbstractStringSerialiserPrivate::loadVariant
              (__return_storage_ptr__,&this->super_AbstractStringSerialiserPrivate,iVar1,&local_1d8)
    ;
    QString::~QString(&local_1d8);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant HtmlModelSerialiserPrivate::readHtmlVariant(QXmlStreamReader &reader, int valType) const
{
    if (isImageType(valType)) {
        if (!reader.readNextStartElement())
            return QVariant();
        if (reader.name() != QStringLiteral("img"))
            return QVariant();
        const QXmlStreamAttributes imgAttributes = reader.attributes();
        if (!imgAttributes.hasAttribute(QStringLiteral("src")))
            return QVariant();
        return loadVariant(valType, imgAttributes.value(QStringLiteral("src")).toString().remove(0, QStringLiteral("data:image/png;base64,").size()));
    }
    return loadVariant(valType, reader.readElementText());
}